

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChQuaternion<double>::Q_to_Rotv
          (ChVector<double> *__return_storage_ptr__,ChQuaternion<double> *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar1 = *(undefined1 (*) [16])(this->m_data + 1);
  dVar2 = this->m_data[3];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar2;
  dVar3 = auVar1._0_8_;
  auVar5._0_8_ = dVar3 * dVar3;
  dVar4 = auVar1._8_8_;
  auVar5._8_8_ = dVar4 * dVar4;
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  auVar1 = vfmadd231sd_fma(auVar5,auVar1,auVar1);
  auVar1 = vfmadd231sd_fma(auVar1,auVar6,auVar6);
  if (auVar1._0_8_ <= 1e-30) {
    dVar3 = dVar3 + dVar3;
    dVar4 = dVar4 + dVar4;
    dVar2 = dVar2 + dVar2;
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar2 = atan2(auVar1._0_8_,this->m_data[0]);
    dVar2 = (dVar2 + dVar2) / auVar1._0_8_;
    dVar3 = dVar2 * this->m_data[1];
    dVar4 = dVar2 * this->m_data[2];
    dVar2 = dVar2 * this->m_data[3];
  }
  __return_storage_ptr__->m_data[0] = dVar3;
  __return_storage_ptr__->m_data[1] = dVar4;
  __return_storage_ptr__->m_data[2] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChQuaternion<Real>::Q_to_Rotv() {
    ChVector<Real> angle_axis;
    Real sin_squared = m_data[1] * m_data[1] + m_data[2] * m_data[2] + m_data[3] * m_data[3];
    // For non-zero rotation
    if (sin_squared > 1e-30) {
        Real sin_theta = sqrt(sin_squared);
        Real k = 2 * atan2(sin_theta, m_data[0]) / sin_theta;
        angle_axis.x() = m_data[1] * k;
        angle_axis.y() = m_data[2] * k;
        angle_axis.z() = m_data[3] * k;
    } else {
        // For almost zero rotation
        Real k(2.0);
        angle_axis.x() = m_data[1] * k;
        angle_axis.y() = m_data[2] * k;
        angle_axis.z() = m_data[3] * k;
    }
    return angle_axis;
}